

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrappeTorsionType.hpp
# Opt level: O1

ostream * OpenMD::operator<<(ostream *os,TrappeTorsionType *ttt)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"This TrappeTorsionType has below form:",0x26);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>(ttt->c0_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," + ",3);
  poVar1 = std::ostream::_M_insert<double>(ttt->c1_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"*(1+cos(phi))",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," + ",3);
  poVar1 = std::ostream::_M_insert<double>(ttt->c2_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"*(1-cos(2*phi))",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," + ",3);
  poVar1 = std::ostream::_M_insert<double>(ttt->c3_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"*(1+cos(3*phi))",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, TrappeTorsionType& ttt) {
    os << "This TrappeTorsionType has below form:" << std::endl;
    os << ttt.c0_ << " + " << ttt.c1_ << "*(1+cos(phi))"
       << " + " << ttt.c2_ << "*(1-cos(2*phi))"
       << " + " << ttt.c3_ << "*(1+cos(3*phi))" << std::endl;
    return os;
  }